

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O2

void Cnf_DataFree(Cnf_Dat_t *p)

{
  Vec_Int_t *__ptr;
  int **__ptr_00;
  
  if (p == (Cnf_Dat_t *)0x0) {
    return;
  }
  __ptr = p->vMapping;
  if (__ptr != (Vec_Int_t *)0x0) {
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
      p->vMapping->pArray = (int *)0x0;
      __ptr = p->vMapping;
      if (__ptr == (Vec_Int_t *)0x0) goto LAB_0046bd37;
    }
    free(__ptr);
    p->vMapping = (Vec_Int_t *)0x0;
  }
LAB_0046bd37:
  if (p->pClaPols != (uchar *)0x0) {
    free(p->pClaPols);
    p->pClaPols = (uchar *)0x0;
  }
  if (p->pObj2Clause != (int *)0x0) {
    free(p->pObj2Clause);
    p->pObj2Clause = (int *)0x0;
  }
  if (p->pObj2Count != (int *)0x0) {
    free(p->pObj2Count);
    p->pObj2Count = (int *)0x0;
  }
  __ptr_00 = p->pClauses;
  if (*__ptr_00 != (int *)0x0) {
    free(*__ptr_00);
    *p->pClauses = (int *)0x0;
    __ptr_00 = p->pClauses;
    if (__ptr_00 == (int **)0x0) goto LAB_0046bd9f;
  }
  free(__ptr_00);
  p->pClauses = (int **)0x0;
LAB_0046bd9f:
  free(p->pVarNums);
  free(p);
  return;
}

Assistant:

void Cnf_DataFree( Cnf_Dat_t * p )
{
    if ( p == NULL )
        return;
    Vec_IntFreeP( &p->vMapping );
    ABC_FREE( p->pClaPols );
    ABC_FREE( p->pObj2Clause );
    ABC_FREE( p->pObj2Count );
    ABC_FREE( p->pClauses[0] );
    ABC_FREE( p->pClauses );
    ABC_FREE( p->pVarNums );
    ABC_FREE( p );
}